

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall
cmMakefile::AddNewUtilityTarget(cmMakefile *this,string *utilityName,bool excludeFromAll)

{
  cmTarget *this_00;
  undefined7 in_register_00000011;
  allocator<char> local_39;
  string local_38;
  
  this_00 = AddNewTarget(this,UTILITY,utilityName);
  if ((int)CONCAT71(in_register_00000011,excludeFromAll) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"EXCLUDE_FROM_ALL",&local_39);
    cmTarget::SetProperty(this_00,&local_38,"TRUE");
    std::__cxx11::string::~string((string *)&local_38);
  }
  return this_00;
}

Assistant:

cmTarget* cmMakefile::AddNewUtilityTarget(const std::string& utilityName,
                                          bool excludeFromAll)
{
  cmTarget* target = this->AddNewTarget(cmStateEnums::UTILITY, utilityName);
  if (excludeFromAll) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  return target;
}